

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

size_t roaring64_bitmap_portable_deserialize_size(char *buf,size_t maxbytes)

{
  ulong uVar1;
  char *in_RSI;
  ulong *in_RDI;
  size_t bitmap32_size;
  uint32_t high32;
  uint64_t bucket;
  uint64_t buckets;
  size_t read_bytes;
  size_t in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  ulong local_30;
  char *local_20;
  char *local_8;
  
  if (in_RDI == (ulong *)0x0) {
    local_8 = (char *)0x0;
  }
  else if (in_RSI < (char *)0x8) {
    local_8 = (char *)0x0;
  }
  else {
    uVar1 = *in_RDI;
    local_20 = (char *)0x8;
    if (uVar1 < 0x100000000) {
      for (local_30 = 0; local_30 < uVar1; local_30 = local_30 + 1) {
        if (in_RSI < local_20 + 4) {
          return 0;
        }
        in_stack_ffffffffffffffc0 =
             (char *)roaring_bitmap_portable_deserialize_size
                               (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        if (in_stack_ffffffffffffffc0 == (char *)0x0) {
          return 0;
        }
        local_20 = in_stack_ffffffffffffffc0 + (long)(local_20 + 4);
      }
      local_8 = local_20;
    }
    else {
      local_8 = (char *)0x0;
    }
  }
  return (size_t)local_8;
}

Assistant:

size_t roaring64_bitmap_portable_deserialize_size(const char *buf,
                                                  size_t maxbytes) {
    // https://github.com/RoaringBitmap/RoaringFormatSpec#extension-for-64-bit-implementations
    if (buf == NULL) {
        return 0;
    }
    size_t read_bytes = 0;

    // Read as uint64 the distinct number of "buckets", where a bucket is
    // defined as the most significant 32 bits of an element.
    uint64_t buckets;
    if (read_bytes + sizeof(buckets) > maxbytes) {
        return 0;
    }
    memcpy(&buckets, buf, sizeof(buckets));
    buf += sizeof(buckets);
    read_bytes += sizeof(buckets);

    // Buckets should be 32 bits with 4 bits of zero padding.
    if (buckets > UINT32_MAX) {
        return 0;
    }

    // Iterate through buckets ordered by increasing keys.
    for (uint64_t bucket = 0; bucket < buckets; ++bucket) {
        // Read as uint32 the most significant 32 bits of the bucket.
        uint32_t high32;
        if (read_bytes + sizeof(high32) > maxbytes) {
            return 0;
        }
        buf += sizeof(high32);
        read_bytes += sizeof(high32);

        // Read the 32-bit Roaring bitmaps representing the least significant
        // bits of a set of elements.
        size_t bitmap32_size = roaring_bitmap_portable_deserialize_size(
            buf, maxbytes - read_bytes);
        if (bitmap32_size == 0) {
            return 0;
        }
        buf += bitmap32_size;
        read_bytes += bitmap32_size;
    }
    return read_bytes;
}